

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLString.cpp
# Opt level: O1

void xercesc_4_0::XMLString::removeChar(XMLCh *srcString,XMLCh *toRemove,XMLBuffer *dstBuffer)

{
  XMLSize_t XVar1;
  XMLCh XVar2;
  XMLCh *pXVar3;
  
  if (srcString != (XMLCh *)0x0) {
    dstBuffer->fIndex = 0;
    XVar2 = *srcString;
    if (XVar2 != L'\0') {
      pXVar3 = srcString + 1;
      do {
        if (XVar2 != *toRemove) {
          if (dstBuffer->fIndex == dstBuffer->fCapacity) {
            XMLBuffer::ensureCapacity(dstBuffer,1);
          }
          XVar1 = dstBuffer->fIndex;
          dstBuffer->fIndex = XVar1 + 1;
          dstBuffer->fBuffer[XVar1] = XVar2;
        }
        XVar2 = *pXVar3;
        pXVar3 = pXVar3 + 1;
      } while (XVar2 != L'\0');
    }
  }
  return;
}

Assistant:

void XMLString::removeChar(const XMLCh*     const srcString
                         , const XMLCh&           toRemove
                         ,       XMLBuffer&       dstBuffer)
{
    if(!srcString) return;
    const XMLCh* pszSrc = srcString;
    XMLCh c;

    dstBuffer.reset();

    while ((c=*pszSrc++)!=0)
    {
        if (c != toRemove)
            dstBuffer.append(c);
    }
}